

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketHandshake.h
# Opt level: O3

void __thiscall
uWS::WebSocketHandshake::static_for<1,_uWS::WebSocketHandshake::Sha1Loop<2>_>::operator()
          (static_for<1,_uWS::WebSocketHandshake::Sha1Loop<2>_> *this,uint32_t *a,uint32_t *b)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = b[8] ^ b[0xd] ^ b[2] ^ *b;
  uVar2 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  *b = uVar2;
  uVar1 = a[4];
  a[1] = ((a[3] ^ a[2]) & uVar1 ^ a[2]) + (*a << 5 | *a >> 0x1b) + uVar2 + a[1] + 0x5a827999;
  a[4] = uVar1 << 0x1e | uVar1 >> 2;
  return;
}

Assistant:

static inline uint32_t rol(uint32_t value, size_t bits) {return (value << bits) | (value >> (32 - bits));}